

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

void __thiscall VertexClustering::start(VertexClustering *this)

{
  bool bVar1;
  
  puts("--- first clustering iteration ---");
  computeClusters(this,false);
  if ((this->opts).validation == true) {
    bVar1 = removeUnconnected(this);
    if (bVar1) {
      puts("---second clustering iteration---");
      computeClusters(this,true);
      return;
    }
  }
  return;
}

Assistant:

void VertexClustering::start() {
	printf("--- first clustering iteration ---\n");
	computeClusters(false); 
	if (opts.validation) {
		if (removeUnconnected()) {
			printf("---second clustering iteration---\n");
			computeClusters(true);
		}
	}
}